

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmCallm<(moira::Instr)142,(moira::Mode)2,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  char cVar6;
  Ea<(moira::Mode)2,_4> dst;
  u32 local_2c;
  ushort local_28;
  
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])();
  local_28 = op & 7;
  local_2c = *addr;
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar6 = 'c';
    lVar5 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar6;
      cVar6 = "callm"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar4 = str->ptr;
      do {
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        pcVar4 = str->ptr;
      } while (pcVar4 < str->base + iVar1);
    }
    str->ptr = pcVar4 + 1;
    *pcVar4 = '#';
    StrWriter::operator<<(str,(Int)(int)(char)uVar3);
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)2,_4> *)&local_2c);
  }
  else {
    cVar6 = 'c';
    lVar5 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar6;
      cVar6 = "callm"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
      pcVar4 = str->ptr;
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar4 = str->ptr;
      do {
        str->ptr = pcVar4 + 1;
        *pcVar4 = ' ';
        pcVar4 = str->ptr;
      } while (pcVar4 < str->base + iVar1);
    }
    str->ptr = pcVar4 + 1;
    *pcVar4 = '#';
    StrWriter::operator<<(str,(UInt)(uVar3 & 0xff));
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)2,_4> *)&local_2c);
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      cVar6 = ';';
      lVar5 = 1;
      do {
        pcVar4 = str->ptr;
        str->ptr = pcVar4 + 1;
        *pcVar4 = cVar6;
        cVar6 = "rtm     %c%d; (2)"[lVar5 + 0xc];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
    }
  }
  return;
}

Assistant:

void
Moira::dasmCallm(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = dasmIncRead(addr) & 0xFF;
    auto dst = Op<M, S>( _____________xxx(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << Ims<Byte>(src) << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << str.tab << Imu(src) << Sep{} << dst << Av<I, M, S>{};
    }
}